

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall
Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)7,_true>::ControlPacket
          (ControlPacket<(Protocol::MQTT::Common::ControlPacketType)7,_true> *this)

{
  ControlPacket<(Protocol::MQTT::Common::ControlPacketType)7,_true> *this_local;
  
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_0013c210;
  ControlPacketSerializableImpl::ControlPacketSerializableImpl
            (&this->super_ControlPacketSerializableImpl,&(this->header).super_FixedHeaderBase,
             (FixedFieldGeneric *)&this->fixedVariableHeader,
             &(this->props).super_SerializableProperties,&this->payload);
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_0013c210;
  FixedHeaderType<(Protocol::MQTT::Common::ControlPacketType)7,_(unsigned_char)'\x00'>::
  FixedHeaderType(&this->header);
  FixedField<(Protocol::MQTT::Common::ControlPacketType)7>::FixedField(&this->fixedVariableHeader);
  PropertiesView::PropertiesView(&this->props);
  SerializablePayload::SerializablePayload(&this->payload);
  SerializablePayload::setFlags(&this->payload,(FixedFieldGeneric *)&this->fixedVariableHeader);
  FixedFieldGeneric::setFlags
            ((FixedFieldGeneric *)&this->fixedVariableHeader,
             &(this->header).super_FixedHeaderBase.typeAndFlags);
  return;
}

Assistant:

ControlPacket() : ControlPacketSerializableImpl(header, fixedVariableHeader, props, payload)
                {
                    payload.setFlags(fixedVariableHeader); fixedVariableHeader.setFlags(header.typeAndFlags);
                }